

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O2

NearestNeighborsIndex * __thiscall
CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex
          (KNearestNeighborsClassifier *this)

{
  NearestNeighborsIndex *this_00;
  
  this_00 = this->nearestneighborsindex_;
  if (this_00 == (NearestNeighborsIndex *)0x0) {
    this_00 = (NearestNeighborsIndex *)operator_new(0x50);
    NearestNeighborsIndex::NearestNeighborsIndex(this_00);
    this->nearestneighborsindex_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::NearestNeighborsIndex* KNearestNeighborsClassifier::mutable_nearestneighborsindex() {
  
  if (nearestneighborsindex_ == NULL) {
    nearestneighborsindex_ = new ::CoreML::Specification::NearestNeighborsIndex;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.KNearestNeighborsClassifier.nearestNeighborsIndex)
  return nearestneighborsindex_;
}